

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase389::run(TestCase389 *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  ArrayDisposer *pAVar4;
  ArrayDisposer *extraout_RDX;
  ArrayDisposer *extraout_RDX_00;
  ArrayDisposer *extraout_RDX_01;
  char8_t (*pacVar5) [5];
  undefined1 in_R8B;
  size_t sVar6;
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_char> text;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  ArrayPtr<const_char> text_04;
  ArrayPtr<const_char> text_05;
  ArrayPtr<const_char> text_06;
  ArrayPtr<const_char> text_07;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> text_08;
  ArrayPtr<const_char> text_09;
  ArrayPtr<const_char> expected_00;
  ArrayPtr<const_char> text_10;
  ArrayPtr<const_char> text_11;
  DebugComparison<kj::String,_const_char_(&)[55]> _kjCondition;
  byte bytes [12];
  undefined1 local_248 [48];
  bool local_218;
  String local_208;
  DebugExpression<kj::String> local_1e8;
  char8_t (*local_1c8) [5];
  size_t sStack_1c0;
  ArrayDisposer *local_1b8;
  undefined1 local_1b0;
  char8_t (*local_1a8) [5];
  size_t sStack_1a0;
  ArrayDisposer *local_198;
  undefined1 local_190;
  char8_t (*local_188) [5];
  size_t sStack_180;
  ArrayDisposer *local_178;
  undefined1 local_170;
  char8_t (*local_168) [5];
  size_t sStack_160;
  ArrayDisposer *local_158;
  undefined1 local_150;
  char8_t (*local_148) [5];
  size_t sStack_140;
  ArrayDisposer *local_138;
  undefined1 local_130;
  EncodingResult<kj::String> local_128;
  EncodingResult<kj::String> local_108;
  EncodingResult<kj::String> local_e8;
  EncodingResult<kj::String> local_c8;
  EncodingResult<kj::String> local_a8;
  EncodingResult<kj::String> local_88;
  EncodingResult<kj::String> local_68;
  EncodingResult<kj::String> local_48;
  undefined8 local_20;
  undefined4 local_18;
  
  kj::_::encodeCEscapeImpl
            (&local_208,(_ *)anon_var_dwarf_3b6e4d,(ArrayPtr<const_unsigned_char>)ZEXT816(0x2c),
             (bool)in_R8B);
  local_1e8.value.content.ptr = local_208.content.ptr;
  local_1e8.value.content.size_ = local_208.content.size_;
  local_1e8.value.content.disposer = local_208.content.disposer;
  local_208.content.ptr = (char *)0x0;
  local_208.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[55]> *)local_248,&local_1e8,
             &anon_var_dwarf_3b6e68);
  sVar6 = local_1e8.value.content.size_;
  pcVar3 = local_1e8.value.content.ptr;
  if (local_1e8.value.content.ptr != (char *)0x0) {
    local_1e8.value.content.ptr = (char *)0x0;
    local_1e8.value.content.size_ = 0;
    (**(local_1e8.value.content.disposer)->_vptr_ArrayDisposer)
              (local_1e8.value.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  sVar6 = local_208.content.size_;
  pcVar3 = local_208.content.ptr;
  if (local_208.content.ptr != (char *)0x0) {
    local_208.content.ptr = (char *)0x0;
    local_208.content.size_ = 0;
    (**(local_208.content.disposer)->_vptr_ArrayDisposer)
              (local_208.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  if ((local_218 == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0x8f;
    kj::_::Debug::log<char_const(&)[243],kj::_::DebugComparison<kj::String,char_const(&)[55]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x187,ERROR,anon_var_dwarf_3b6e75,&anon_var_dwarf_3b6e91,
               (DebugComparison<kj::String,_const_char_(&)[55]> *)local_248);
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  kj::_::encodeCEscapeImpl
            (&local_208,(_ *)"foo\x01\x7fxxx",(ArrayPtr<const_unsigned_char>)ZEXT816(8),(bool)in_R8B
            );
  local_1e8.value.content.ptr = local_208.content.ptr;
  local_1e8.value.content.size_ = local_208.content.size_;
  local_1e8.value.content.disposer = local_208.content.disposer;
  local_208.content.ptr = (char *)0x0;
  local_208.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[15]> *)local_248,&local_1e8,
             (char (*) [15])"foo\\001\\177xxx");
  sVar6 = local_1e8.value.content.size_;
  pcVar3 = local_1e8.value.content.ptr;
  if (local_1e8.value.content.ptr != (char *)0x0) {
    local_1e8.value.content.ptr = (char *)0x0;
    local_1e8.value.content.size_ = 0;
    (**(local_1e8.value.content.disposer)->_vptr_ArrayDisposer)
              (local_1e8.value.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  sVar6 = local_208.content.size_;
  pcVar3 = local_208.content.ptr;
  if (local_208.content.ptr != (char *)0x0) {
    local_208.content.ptr = (char *)0x0;
    local_208.content.size_ = 0;
    (**(local_208.content.disposer)->_vptr_ArrayDisposer)
              (local_208.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  if ((local_218 == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0xfe;
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::String,char_const(&)[15]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x189,ERROR,
               "\"failed: expected \" \"encodeCEscape(\\\"foo\\\\x01\\\\x7fxxx\\\") == \\\"foo\\\\\\\\001\\\\\\\\177xxx\\\"\", _kjCondition"
               ,(char (*) [71])
                "failed: expected encodeCEscape(\"foo\\x01\\x7fxxx\") == \"foo\\\\001\\\\177xxx\"",
               (DebugComparison<kj::String,_const_char_(&)[15]> *)local_248);
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  local_20 = 0x78787f01006f6f66;
  local_18 = 0xfffe8078;
  bytes_00.size_ = 1;
  bytes_00.ptr = &DAT_0000000c;
  kj::_::encodeCEscapeImpl(&local_208,(_ *)&local_20,bytes_00,(bool)in_R8B);
  local_1e8.value.content.ptr = local_208.content.ptr;
  local_1e8.value.content.size_ = local_208.content.size_;
  local_1e8.value.content.disposer = local_208.content.disposer;
  local_208.content.ptr = (char *)0x0;
  local_208.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[31]> *)local_248,&local_1e8,
             (char (*) [31])"foo\\000\\001\\177xxx\\200\\376\\377");
  sVar6 = local_1e8.value.content.size_;
  pcVar3 = local_1e8.value.content.ptr;
  if (local_1e8.value.content.ptr != (char *)0x0) {
    local_1e8.value.content.ptr = (char *)0x0;
    local_1e8.value.content.size_ = 0;
    (**(local_1e8.value.content.disposer)->_vptr_ArrayDisposer)
              (local_1e8.value.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  sVar6 = local_208.content.size_;
  pcVar3 = local_208.content.ptr;
  if (local_208.content.ptr != (char *)0x0) {
    local_208.content.ptr = (char *)0x0;
    local_208.content.size_ = 0;
    (**(local_208.content.disposer)->_vptr_ArrayDisposer)
              (local_208.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  if ((local_218 == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0xd5;
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugComparison<kj::String,char_const(&)[31]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x18b,ERROR,
               "\"failed: expected \" \"encodeCEscape(bytes) == \\\"foo\\\\\\\\000\\\\\\\\001\\\\\\\\177xxx\\\\\\\\200\\\\\\\\376\\\\\\\\377\\\"\", _kjCondition"
               ,(char (*) [80])
                "failed: expected encodeCEscape(bytes) == \"foo\\\\000\\\\001\\\\177xxx\\\\200\\\\376\\\\377\""
               ,(DebugComparison<kj::String,_const_char_(&)[31]> *)local_248);
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text.size_ = 1;
  text.ptr = &DAT_0000001b;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"fooo\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\\\bar",text,(bool)in_R8B);
  sStack_140 = local_248._8_8_;
  local_148 = (char8_t (*) [5])local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_148 = (char8_t (*) [5])0x0;
    sStack_140 = 0;
    local_138 = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_138 = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_130 = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  local_248._0_8_ = local_148;
  local_248._8_8_ = sStack_140;
  local_248._16_8_ = local_138;
  local_148 = (char8_t (*) [5])0x0;
  sStack_140 = 0;
  local_248[0x18] = (bool)local_130;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,
             (EncodingResult<kj::String> *)"fooo\a\b\f\n\r\t\v\'\"\\bar",
             (ArrayPtr<const_char>)ZEXT816(0x11),(bool)in_R8B);
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  sVar6 = sStack_140;
  pacVar5 = local_148;
  if (local_148 != (char8_t (*) [5])0x0) {
    local_148 = (char8_t (*) [5])0x0;
    sStack_140 = 0;
    (**local_138->_vptr_ArrayDisposer)(local_138,pacVar5,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_00.size_ = 1;
  text_00.ptr = &DAT_0000000e;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"foo\\x01\\x7fxxx",text_00,(bool)in_R8B);
  local_48.super_String.content.size_ = local_248._8_8_;
  local_48.super_String.content.ptr = (char *)local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_48.super_String.content.ptr = (char *)0x0;
    local_48.super_String.content.size_ = 0;
    local_48.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_48.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_48.hadErrors = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  (anonymous_namespace)::expectRes<kj::String,char,9ul>
            (&local_48,(char (*) [9])"foo\x01\x7fxxx",false);
  sVar6 = local_48.super_String.content.size_;
  pcVar3 = local_48.super_String.content.ptr;
  if ((char8_t (*) [5])local_48.super_String.content.ptr != (char8_t (*) [5])0x0) {
    local_48.super_String.content.ptr = (char *)0x0;
    local_48.super_String.content.size_ = 0;
    (**(local_48.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_48.super_String.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_01.size_ = 1;
  text_01.ptr = &DAT_0000000e;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"foo\\001\\177234",text_01,(bool)in_R8B);
  local_68.super_String.content.size_ = local_248._8_8_;
  local_68.super_String.content.ptr = (char *)local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_68.super_String.content.ptr = (char *)0x0;
    local_68.super_String.content.size_ = 0;
    local_68.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_68.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_68.hadErrors = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  (anonymous_namespace)::expectRes<kj::String,char,9ul>
            (&local_68,(char (*) [9])"foo\x01\x7f234",false);
  sVar6 = local_68.super_String.content.size_;
  pcVar3 = local_68.super_String.content.ptr;
  if ((char8_t (*) [5])local_68.super_String.content.ptr != (char8_t (*) [5])0x0) {
    local_68.super_String.content.ptr = (char *)0x0;
    local_68.super_String.content.size_ = 0;
    (**(local_68.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_68.super_String.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_02.size_ = 1;
  text_02.ptr = &DAT_00000006;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\x1",text_02
                      ,(bool)in_R8B);
  local_88.super_String.content.size_ = local_248._8_8_;
  local_88.super_String.content.ptr = (char *)local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_88.super_String.content.ptr = (char *)0x0;
    local_88.super_String.content.size_ = 0;
    local_88.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_88.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_88.hadErrors = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_88,(char (*) [5])"foo\x01",false);
  sVar6 = local_88.super_String.content.size_;
  pcVar3 = local_88.super_String.content.ptr;
  if ((char8_t (*) [5])local_88.super_String.content.ptr != (char8_t (*) [5])0x0) {
    local_88.super_String.content.ptr = (char *)0x0;
    local_88.super_String.content.size_ = 0;
    (**(local_88.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_88.super_String.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_03.size_ = 1;
  text_03.ptr = &DAT_00000005;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\1",text_03,
                      (bool)in_R8B);
  local_a8.super_String.content.size_ = local_248._8_8_;
  local_a8.super_String.content.ptr = (char *)local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_a8.super_String.content.ptr = (char *)0x0;
    local_a8.super_String.content.size_ = 0;
    local_a8.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_a8.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_a8.hadErrors = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_a8,(char (*) [5])"foo\x01",false);
  sVar6 = local_a8.super_String.content.size_;
  pcVar3 = local_a8.super_String.content.ptr;
  if ((char8_t (*) [5])local_a8.super_String.content.ptr != (char8_t (*) [5])0x0) {
    local_a8.super_String.content.ptr = (char *)0x0;
    local_a8.super_String.content.size_ = 0;
    (**(local_a8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.super_String.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_04.size_ = 1;
  text_04.ptr = &DAT_0000000c;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\u1234bar",
                      text_04,(bool)in_R8B);
  sStack_160 = local_248._8_8_;
  local_168 = (char8_t (*) [5])local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_168 = (char8_t (*) [5])0x0;
    sStack_160 = 0;
    local_158 = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_158 = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_150 = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  local_248._0_8_ = local_168;
  local_248._8_8_ = sStack_160;
  local_248._16_8_ = local_158;
  local_168 = (char8_t (*) [5])0x0;
  sStack_160 = 0;
  local_248[0x18] = (bool)local_150;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,(EncodingResult<kj::String> *)anon_var_dwarf_3b6fa7,
             (ArrayPtr<const_char>)ZEXT816(9),(bool)in_R8B);
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  sVar6 = sStack_160;
  pacVar5 = local_168;
  if (local_168 != (char8_t (*) [5])0x0) {
    local_168 = (char8_t (*) [5])0x0;
    sStack_160 = 0;
    (**local_158->_vptr_ArrayDisposer)(local_158,pacVar5,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_05.size_ = 1;
  text_05.ptr = &DAT_00000010;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"foo\\U00045678bar",text_05,(bool)in_R8B);
  sStack_180 = local_248._8_8_;
  local_188 = (char8_t (*) [5])local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_188 = (char8_t (*) [5])0x0;
    sStack_180 = 0;
    local_178 = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_178 = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_170 = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  local_248._0_8_ = local_188;
  local_248._8_8_ = sStack_180;
  local_248._16_8_ = local_178;
  local_188 = (char8_t (*) [5])0x0;
  sStack_180 = 0;
  local_248[0x18] = (bool)local_170;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,(EncodingResult<kj::String> *)anon_var_dwarf_3b6fcf,
             (ArrayPtr<const_char>)ZEXT816(10),(bool)in_R8B);
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  sVar6 = sStack_180;
  pacVar5 = local_188;
  if (local_188 != (char8_t (*) [5])0x0) {
    local_188 = (char8_t (*) [5])0x0;
    sStack_180 = 0;
    (**local_178->_vptr_ArrayDisposer)(local_178,pacVar5,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_06.size_ = 1;
  text_06.ptr = &DAT_00000004;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\",text_06,
                      (bool)in_R8B);
  local_c8.super_String.content.size_ = local_248._8_8_;
  local_c8.super_String.content.ptr = (char *)local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_c8.super_String.content.ptr = (char *)0x0;
    local_c8.super_String.content.size_ = 0;
    pAVar4 = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    pAVar4 = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  pacVar5 = (char8_t (*) [5])local_248._0_8_;
  local_c8.hadErrors = local_248[0x18];
  local_c8.super_String.content.disposer = pAVar4;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,pacVar5,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
    pAVar4 = extraout_RDX;
  }
  (anonymous_namespace)::expectRes<kj::String,char,4ul>
            (&local_c8,(char (*) [4])pacVar5,SUB81(pAVar4,0));
  sVar6 = local_c8.super_String.content.size_;
  pcVar3 = local_c8.super_String.content.ptr;
  if ((char8_t (*) [5])local_c8.super_String.content.ptr != (char8_t (*) [5])0x0) {
    local_c8.super_String.content.ptr = (char *)0x0;
    local_c8.super_String.content.size_ = 0;
    (**(local_c8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.super_String.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_07.size_ = 1;
  text_07.ptr = &DAT_00000009;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\x123x",
                      text_07,(bool)in_R8B);
  sStack_1a0 = local_248._8_8_;
  local_1a8 = (char8_t (*) [5])local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_1a8 = (char8_t (*) [5])0x0;
    sStack_1a0 = 0;
    local_198 = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_198 = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_190 = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  local_248._0_8_ = local_1a8;
  local_248._8_8_ = sStack_1a0;
  local_248._16_8_ = local_198;
  local_1a8 = (char8_t (*) [5])0x0;
  sStack_1a0 = 0;
  local_248[0x18] = (bool)local_190;
  expected.size_ = 1;
  expected.ptr = &DAT_00000005;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,(EncodingResult<kj::String> *)"foo#x",expected,
             (bool)in_R8B);
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  sVar6 = sStack_1a0;
  pacVar5 = local_1a8;
  if (local_1a8 != (char8_t (*) [5])0x0) {
    local_1a8 = (char8_t (*) [5])0x0;
    sStack_1a0 = 0;
    (**local_198->_vptr_ArrayDisposer)(local_198,pacVar5,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_08.size_ = 1;
  text_08.ptr = (char *)0x7;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\u12",
                      text_08,(bool)in_R8B);
  local_e8.super_String.content.size_ = local_248._8_8_;
  local_e8.super_String.content.ptr = (char *)local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_e8.super_String.content.ptr = (char *)0x0;
    local_e8.super_String.content.size_ = 0;
    pAVar4 = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    pAVar4 = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  pacVar5 = (char8_t (*) [5])local_248._0_8_;
  local_e8.hadErrors = local_248[0x18];
  local_e8.super_String.content.disposer = pAVar4;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,pacVar5,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
    pAVar4 = extraout_RDX_00;
  }
  (anonymous_namespace)::expectRes<kj::String,5ul>(&local_e8,pacVar5,SUB81(pAVar4,0));
  sVar6 = local_e8.super_String.content.size_;
  pcVar3 = local_e8.super_String.content.ptr;
  if ((char8_t (*) [5])local_e8.super_String.content.ptr != (char8_t (*) [5])0x0) {
    local_e8.super_String.content.ptr = (char *)0x0;
    local_e8.super_String.content.size_ = 0;
    (**(local_e8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.super_String.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_09.size_ = 1;
  text_09.ptr = (char *)0xa;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\u12xxx",
                      text_09,(bool)in_R8B);
  sStack_1c0 = local_248._8_8_;
  local_1c8 = (char8_t (*) [5])local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_1c8 = (char8_t (*) [5])0x0;
    sStack_1c0 = 0;
    local_1b8 = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_1b8 = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_1b0 = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  local_248._0_8_ = local_1c8;
  local_248._8_8_ = sStack_1c0;
  local_248._16_8_ = local_1b8;
  local_1c8 = (char8_t (*) [5])0x0;
  sStack_1c0 = 0;
  local_248[0x18] = (bool)local_1b0;
  expected_00.size_ = 1;
  expected_00.ptr = (char *)0x7;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,(EncodingResult<kj::String> *)"foo\x12xxx",
             expected_00,(bool)in_R8B);
  sVar6 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  sVar6 = sStack_1c0;
  pacVar5 = local_1c8;
  if (local_1c8 != (char8_t (*) [5])0x0) {
    local_1c8 = (char8_t (*) [5])0x0;
    sStack_1c0 = 0;
    (**local_1b8->_vptr_ArrayDisposer)(local_1b8,pacVar5,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_10.size_ = 1;
  text_10.ptr = (char *)0x7;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\U12",
                      text_10,(bool)in_R8B);
  local_108.super_String.content.size_ = local_248._8_8_;
  local_108.super_String.content.ptr = (char *)local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_108.super_String.content.ptr = (char *)0x0;
    local_108.super_String.content.size_ = 0;
    pAVar4 = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    pAVar4 = (ArrayDisposer *)local_248._16_8_;
  }
  sVar6 = local_248._8_8_;
  pacVar5 = (char8_t (*) [5])local_248._0_8_;
  local_108.hadErrors = local_248[0x18];
  local_108.super_String.content.disposer = pAVar4;
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,pacVar5,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
    pAVar4 = extraout_RDX_01;
  }
  (anonymous_namespace)::expectRes<kj::String,5ul>(&local_108,pacVar5,SUB81(pAVar4,0));
  sVar6 = local_108.super_String.content.size_;
  pcVar3 = local_108.super_String.content.ptr;
  if ((char8_t (*) [5])local_108.super_String.content.ptr != (char8_t (*) [5])0x0) {
    local_108.super_String.content.ptr = (char *)0x0;
    local_108.super_String.content.size_ = 0;
    (**(local_108.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_108.super_String.content.disposer,pcVar3,1,sVar6,sVar6,0);
    in_R8B = (undefined1)sVar6;
  }
  text_11.size_ = 1;
  text_11.ptr = (char *)0xf;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"foo\\U12xxxxxxxx",text_11,(bool)in_R8B);
  local_128.super_String.content.size_ = local_248._8_8_;
  local_128.super_String.content.ptr = (char *)local_248._0_8_;
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_128.super_String.content.ptr = (char *)0x0;
    local_128.super_String.content.size_ = 0;
    local_128.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    local_128.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  uVar2 = local_248._8_8_;
  uVar1 = local_248._0_8_;
  local_128.hadErrors = local_248[0x18];
  if ((char8_t (*) [5])local_248._0_8_ != (char8_t (*) [5])0x0) {
    local_248._0_8_ = (char8_t (*) [5])0x0;
    local_248._8_8_ = 0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,uVar2,uVar2,0);
  }
  (anonymous_namespace)::expectRes<kj::String,13ul>
            (&local_128,(char8_t (*) [13])"foo\x12xxxxxxxx",true);
  sVar6 = local_128.super_String.content.size_;
  pcVar3 = local_128.super_String.content.ptr;
  if ((char8_t (*) [5])local_128.super_String.content.ptr != (char8_t (*) [5])0x0) {
    local_128.super_String.content.ptr = (char *)0x0;
    local_128.super_String.content.size_ = 0;
    (**(local_128.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_128.super_String.content.disposer,pcVar3,1,sVar6,sVar6,0);
  }
  return;
}

Assistant:

TEST(Async, SeparateFulfillerChained) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<Promise<int>>();
  auto inner = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(kj::mv(inner.promise));
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  inner.fulfiller->fulfill(123);

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}